

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

bool __thiscall
flatbuffers::rust::RustGenerator::GenerateSymbols<flatbuffers::EnumDef>
          (RustGenerator *this,SymbolTable<flatbuffers::EnumDef> *symbols,
          function<void_(const_flatbuffers::EnumDef_&)> *gen_symbol)

{
  CodeWriter *this_00;
  IdlNamer *pIVar1;
  pointer ppEVar2;
  EnumDef *__args;
  _Alloc_hider name;
  bool bVar3;
  pointer ppEVar4;
  char *__s;
  string file_path;
  string local_210;
  string directories;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->code_;
  pIVar1 = &this->namer_;
  for (ppEVar4 = (symbols->vec).
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 = (symbols->vec).
                super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppEVar4 != ppEVar2; ppEVar4 = ppEVar4 + 1
      ) {
    __args = *ppEVar4;
    if ((__args->super_Definition).generated == false) {
      CodeWriter::Clear(this_00);
      __s = BaseGenerator::FlatBuffersGeneratedWarning();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&directories,__s,(allocator<char> *)&file_path);
      std::operator+(&local_50,"// ",&directories);
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&directories);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"// @generated",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"extern crate alloc;",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"extern crate flatbuffers;",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"use alloc::boxed::Box;",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"use alloc::string::{String, ToString};",
                 (allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"use alloc::vec::Vec;",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"use core::mem;",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"use core::cmp::Ordering;",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"extern crate serde;",(allocator<char> *)&directories);
        CodeWriter::operator+=(this_00,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,
                   "use self::serde::ser::{Serialize, Serializer, SerializeStruct};",
                   (allocator<char> *)&directories);
        CodeWriter::operator+=(this_00,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"use self::flatbuffers::{EndianScalar, Follow};",
                 (allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"use super::*;",(allocator<char> *)&directories);
      CodeWriter::operator+=(this_00,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      this->cur_name_space_ = (__args->super_Definition).defined_namespace;
      std::function<void_(const_flatbuffers::EnumDef_&)>::operator()(gen_symbol,__args);
      (*(this->namer_).super_Namer._vptr_Namer[0xd])
                (&directories,pIVar1,(__args->super_Definition).defined_namespace,0,1);
      EnsureDirExists(&directories);
      (*(pIVar1->super_Namer)._vptr_Namer[0xc])(&local_210,pIVar1,__args,0);
      std::operator+(&file_path,&directories,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      name = file_path._M_dataplus;
      std::__cxx11::stringbuf::str();
      bVar3 = SaveFile(name._M_p,&local_210,false);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&file_path);
      std::__cxx11::string::~string((string *)&directories);
      if (!bVar3) break;
    }
  }
  return ppEVar4 == ppEVar2;
}

Assistant:

bool GenerateSymbols(const SymbolTable<T> &symbols,
                       std::function<void(const T &)> gen_symbol) {
    for (auto it = symbols.vec.begin(); it != symbols.vec.end(); it++) {
      const T &symbol = **it;
      if (symbol.generated) continue;
      code_.Clear();
      code_ += "// " + std::string(FlatBuffersGeneratedWarning());
      code_ += "// @generated";
      code_ += "extern crate alloc;";
      code_ += "extern crate flatbuffers;";
      code_ += "use alloc::boxed::Box;";
      code_ += "use alloc::string::{String, ToString};";
      code_ += "use alloc::vec::Vec;";
      code_ += "use core::mem;";
      code_ += "use core::cmp::Ordering;";
      if (parser_.opts.rust_serialize) {
        code_ += "extern crate serde;";
        code_ +=
            "use self::serde::ser::{Serialize, Serializer, SerializeStruct};";
      }
      code_ += "use self::flatbuffers::{EndianScalar, Follow};";
      code_ += "use super::*;";
      cur_name_space_ = symbol.defined_namespace;
      gen_symbol(symbol);

      const std::string directories =
          namer_.Directories(*symbol.defined_namespace);
      EnsureDirExists(directories);
      const std::string file_path = directories + namer_.File(symbol);
      const bool save_success =
          SaveFile(file_path.c_str(), code_.ToString(), /*binary=*/false);
      if (!save_success) return false;
    }
    return true;
  }